

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O0

void ncnn::quantize_pack4to8(float *ptr0,float *ptr1,char *s8ptr,Mat *scale_data,int elemcount)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  ushort uVar10;
  ushort uVar11;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar34;
  ushort uVar35;
  __m128 _scale1;
  __m128 _scale0;
  float scale;
  int scale_data_size;
  __m128i _v8_1;
  __m128i _v01_s16_1;
  __m128i _v1_i_1;
  __m128i _v0_i_1;
  __m128 _v1_adj_1;
  __m128 _v0_adj_1;
  __m128 _v1_p5_1;
  __m128 _v0_p5_1;
  __m128 _sign1_1;
  __m128 _sign0_1;
  __m128 _signmask_1;
  __m128 _p5_1;
  __m128i _v8;
  __m128i _v23_s16;
  __m128i _v01_s16;
  __m128i _v3_i;
  __m128i _v2_i;
  __m128i _v1_i;
  __m128i _v0_i;
  __m128 _v3_adj;
  __m128 _v2_adj;
  __m128 _v1_adj;
  __m128 _v0_adj;
  __m128 _v3_p5;
  __m128 _v2_p5;
  __m128 _v1_p5;
  __m128 _v0_p5;
  __m128 _sign3;
  __m128 _sign2;
  __m128 _sign1;
  __m128 _sign0;
  __m128 _signmask;
  __m128 _p5;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  int local_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  __m128 _v1_1;
  __m128 _v0_1;
  __m128 _v3;
  __m128 _v2;
  __m128 _v1;
  __m128 _v0;
  int i;
  
  uVar1 = *(undefined4 *)*in_RCX;
  local_9a8 = CONCAT44(uVar1,uVar1);
  uStack_9a0 = CONCAT44(uVar1,uVar1);
  local_998 = local_9a8;
  uStack_990 = uStack_9a0;
  if (1 < *(int *)((long)in_RCX + 0x2c)) {
    local_998 = *(undefined8 *)*in_RCX;
    uStack_990 = ((undefined8 *)*in_RCX)[1];
    local_9a8 = *(undefined8 *)(*in_RCX + 0x10);
    uStack_9a0 = *(undefined8 *)(*in_RCX + 0x18);
  }
  local_9ac = 0;
  local_970 = in_RDX;
  local_968 = in_RSI;
  local_960 = in_RDI;
  while( true ) {
    local_838 = (float)local_998;
    fStack_834 = (float)((ulong)local_998 >> 0x20);
    fStack_830 = (float)uStack_990;
    fStack_82c = (float)((ulong)uStack_990 >> 0x20);
    local_858 = (float)local_9a8;
    fStack_854 = (float)((ulong)local_9a8 >> 0x20);
    fStack_850 = (float)uStack_9a0;
    fStack_84c = (float)((ulong)uStack_9a0 >> 0x20);
    if (in_R8D <= local_9ac + 1) break;
    local_828 = (float)*local_960;
    fStack_824 = (float)((ulong)*local_960 >> 0x20);
    fStack_820 = (float)local_960[1];
    fStack_81c = (float)((ulong)local_960[1] >> 0x20);
    local_9c8 = CONCAT44(fStack_824 * fStack_834,local_828 * local_838);
    uStack_9c0 = CONCAT44(fStack_81c * fStack_82c,fStack_820 * fStack_830);
    local_848 = (float)*local_968;
    fStack_844 = (float)((ulong)*local_968 >> 0x20);
    fStack_840 = (float)local_968[1];
    fStack_83c = (float)((ulong)local_968[1] >> 0x20);
    local_9d8 = CONCAT44(fStack_844 * fStack_854,local_848 * local_858);
    uStack_9d0 = CONCAT44(fStack_83c * fStack_84c,fStack_840 * fStack_850);
    local_868 = (float)local_960[2];
    fStack_864 = (float)((ulong)local_960[2] >> 0x20);
    fStack_860 = (float)local_960[3];
    fStack_85c = (float)((ulong)local_960[3] >> 0x20);
    local_9e8 = CONCAT44(fStack_864 * fStack_834,local_868 * local_838);
    uStack_9e0 = CONCAT44(fStack_85c * fStack_82c,fStack_860 * fStack_830);
    local_888 = (float)local_968[2];
    fStack_884 = (float)((ulong)local_968[2] >> 0x20);
    fStack_880 = (float)local_968[3];
    fStack_87c = (float)((ulong)local_968[3] >> 0x20);
    local_9f8 = CONCAT44(fStack_884 * fStack_854,local_888 * local_858);
    uStack_9f0 = CONCAT44(fStack_87c * fStack_84c,fStack_880 * fStack_850);
    uVar12 = local_9c8 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar26 = uStack_9c0 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar13 = local_9d8 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar27 = uStack_9d0 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar14 = local_9e8 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar28 = uStack_9e0 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar15 = local_9f8 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar29 = uStack_9f0 & 0x8000000080000000 | 0x3f0000003f000000;
    local_1f8 = (float)uVar12;
    fStack_1f4 = (float)(uVar12 >> 0x20);
    fStack_1f0 = (float)uVar26;
    fStack_1ec = (float)(uVar26 >> 0x20);
    local_218 = (float)uVar13;
    fStack_214 = (float)(uVar13 >> 0x20);
    fStack_210 = (float)uVar27;
    fStack_20c = (float)(uVar27 >> 0x20);
    local_238 = (float)uVar14;
    fStack_234 = (float)(uVar14 >> 0x20);
    fStack_230 = (float)uVar28;
    fStack_22c = (float)(uVar28 >> 0x20);
    local_258 = (float)uVar15;
    fStack_254 = (float)(uVar15 >> 0x20);
    fStack_250 = (float)uVar29;
    fStack_24c = (float)(uVar29 >> 0x20);
    auVar7._4_4_ = (int)(fStack_824 * fStack_834 + fStack_1f4);
    auVar7._0_4_ = (int)(local_828 * local_838 + local_1f8);
    auVar7._12_4_ = (int)(fStack_81c * fStack_82c + fStack_1ec);
    auVar7._8_4_ = (int)(fStack_820 * fStack_830 + fStack_1f0);
    auVar16._4_4_ = (int)(fStack_844 * fStack_854 + fStack_214);
    auVar16._0_4_ = (int)(local_848 * local_858 + local_218);
    auVar16._12_4_ = (int)(fStack_83c * fStack_84c + fStack_20c);
    auVar16._8_4_ = (int)(fStack_840 * fStack_850 + fStack_210);
    auVar16 = packssdw(auVar7,auVar16);
    auVar6._4_4_ = (int)(fStack_864 * fStack_834 + fStack_234);
    auVar6._0_4_ = (int)(local_868 * local_838 + local_238);
    auVar6._12_4_ = (int)(fStack_85c * fStack_82c + fStack_22c);
    auVar6._8_4_ = (int)(fStack_860 * fStack_830 + fStack_230);
    auVar17._4_4_ = (int)(fStack_884 * fStack_854 + fStack_254);
    auVar17._0_4_ = (int)(local_888 * local_858 + local_258);
    auVar17._12_4_ = (int)(fStack_87c * fStack_84c + fStack_24c);
    auVar17._8_4_ = (int)(fStack_880 * fStack_850 + fStack_250);
    auVar17 = packssdw(auVar6,auVar17);
    local_128 = auVar16._0_2_;
    sStack_126 = auVar16._2_2_;
    sStack_124 = auVar16._4_2_;
    sStack_122 = auVar16._6_2_;
    sStack_120 = auVar16._8_2_;
    sStack_11e = auVar16._10_2_;
    sStack_11c = auVar16._12_2_;
    sStack_11a = auVar16._14_2_;
    uVar10 = (ushort)(0x7f < local_128) * 0x7f | (ushort)(0x7f >= local_128) * local_128;
    uVar18 = (ushort)(0x7f < sStack_126) * 0x7f | (ushort)(0x7f >= sStack_126) * sStack_126;
    uVar20 = (ushort)(0x7f < sStack_124) * 0x7f | (ushort)(0x7f >= sStack_124) * sStack_124;
    uVar22 = (ushort)(0x7f < sStack_122) * 0x7f | (ushort)(0x7f >= sStack_122) * sStack_122;
    uVar24 = (ushort)(0x7f < sStack_120) * 0x7f | (ushort)(0x7f >= sStack_120) * sStack_120;
    uVar30 = (ushort)(0x7f < sStack_11e) * 0x7f | (ushort)(0x7f >= sStack_11e) * sStack_11e;
    uVar32 = (ushort)(0x7f < sStack_11c) * 0x7f | (ushort)(0x7f >= sStack_11c) * sStack_11c;
    uVar34 = (ushort)(0x7f < sStack_11a) * 0x7f | (ushort)(0x7f >= sStack_11a) * sStack_11a;
    local_148 = auVar17._0_2_;
    sStack_146 = auVar17._2_2_;
    sStack_144 = auVar17._4_2_;
    sStack_142 = auVar17._6_2_;
    sStack_140 = auVar17._8_2_;
    sStack_13e = auVar17._10_2_;
    sStack_13c = auVar17._12_2_;
    sStack_13a = auVar17._14_2_;
    uVar11 = (ushort)(0x7f < local_148) * 0x7f | (ushort)(0x7f >= local_148) * local_148;
    uVar19 = (ushort)(0x7f < sStack_146) * 0x7f | (ushort)(0x7f >= sStack_146) * sStack_146;
    uVar21 = (ushort)(0x7f < sStack_144) * 0x7f | (ushort)(0x7f >= sStack_144) * sStack_144;
    uVar23 = (ushort)(0x7f < sStack_142) * 0x7f | (ushort)(0x7f >= sStack_142) * sStack_142;
    uVar25 = (ushort)(0x7f < sStack_140) * 0x7f | (ushort)(0x7f >= sStack_140) * sStack_140;
    uVar31 = (ushort)(0x7f < sStack_13e) * 0x7f | (ushort)(0x7f >= sStack_13e) * sStack_13e;
    uVar33 = (ushort)(0x7f < sStack_13c) * 0x7f | (ushort)(0x7f >= sStack_13c) * sStack_13c;
    uVar35 = (ushort)(0x7f < sStack_13a) * 0x7f | (ushort)(0x7f >= sStack_13a) * sStack_13a;
    local_4e8._0_4_ =
         CONCAT22((ushort)((short)uVar18 < -0x7f) * -0x7f | ((short)uVar18 >= -0x7f) * uVar18,
                  (ushort)((short)uVar10 < -0x7f) * -0x7f | ((short)uVar10 >= -0x7f) * uVar10);
    local_4e8._0_6_ =
         CONCAT24((ushort)((short)uVar20 < -0x7f) * -0x7f | ((short)uVar20 >= -0x7f) * uVar20,
                  (undefined4)local_4e8);
    local_4e8 = CONCAT26((ushort)((short)uVar22 < -0x7f) * -0x7f | ((short)uVar22 >= -0x7f) * uVar22
                         ,(undefined6)local_4e8);
    uStack_4e0._0_2_ = (ushort)((short)uVar24 < -0x7f) * -0x7f | ((short)uVar24 >= -0x7f) * uVar24;
    uStack_4e0._2_2_ = (ushort)((short)uVar30 < -0x7f) * -0x7f | ((short)uVar30 >= -0x7f) * uVar30;
    uStack_4e0._4_2_ = (ushort)((short)uVar32 < -0x7f) * -0x7f | ((short)uVar32 >= -0x7f) * uVar32;
    uStack_4e0._6_2_ = (ushort)((short)uVar34 < -0x7f) * -0x7f | ((short)uVar34 >= -0x7f) * uVar34;
    local_4f8._0_4_ =
         CONCAT22((ushort)((short)uVar19 < -0x7f) * -0x7f | ((short)uVar19 >= -0x7f) * uVar19,
                  (ushort)((short)uVar11 < -0x7f) * -0x7f | ((short)uVar11 >= -0x7f) * uVar11);
    local_4f8._0_6_ =
         CONCAT24((ushort)((short)uVar21 < -0x7f) * -0x7f | ((short)uVar21 >= -0x7f) * uVar21,
                  (undefined4)local_4f8);
    local_4f8 = CONCAT26((ushort)((short)uVar23 < -0x7f) * -0x7f | ((short)uVar23 >= -0x7f) * uVar23
                         ,(undefined6)local_4f8);
    uStack_4f0._0_2_ = (ushort)((short)uVar25 < -0x7f) * -0x7f | ((short)uVar25 >= -0x7f) * uVar25;
    uStack_4f0._2_2_ = (ushort)((short)uVar31 < -0x7f) * -0x7f | ((short)uVar31 >= -0x7f) * uVar31;
    uStack_4f0._4_2_ = (ushort)((short)uVar33 < -0x7f) * -0x7f | ((short)uVar33 >= -0x7f) * uVar33;
    uStack_4f0._6_2_ = (ushort)((short)uVar35 < -0x7f) * -0x7f | ((short)uVar35 >= -0x7f) * uVar35;
    auVar9._8_8_ = uStack_4e0;
    auVar9._0_8_ = local_4e8;
    auVar8._8_8_ = uStack_4f0;
    auVar8._0_8_ = local_4f8;
    auVar17 = packsswb(auVar9,auVar8);
    local_508 = auVar17._0_8_;
    uStack_500 = auVar17._8_8_;
    *local_970 = local_508;
    local_970[1] = uStack_500;
    local_960 = local_960 + 4;
    local_968 = local_968 + 4;
    local_970 = local_970 + 2;
    local_9ac = local_9ac + 2;
  }
  for (; local_9ac < in_R8D; local_9ac = local_9ac + 1) {
    local_8a8 = (float)*local_960;
    fStack_8a4 = (float)((ulong)*local_960 >> 0x20);
    fStack_8a0 = (float)local_960[1];
    fStack_89c = (float)((ulong)local_960[1] >> 0x20);
    local_a08 = CONCAT44(fStack_8a4 * fStack_834,local_8a8 * local_838);
    uStack_a00 = CONCAT44(fStack_89c * fStack_82c,fStack_8a0 * fStack_830);
    local_8c8 = (float)*local_968;
    fStack_8c4 = (float)((ulong)*local_968 >> 0x20);
    fStack_8c0 = (float)local_968[1];
    fStack_8bc = (float)((ulong)local_968[1] >> 0x20);
    local_a18 = CONCAT44(fStack_8c4 * fStack_854,local_8c8 * local_858);
    uStack_a10 = CONCAT44(fStack_8bc * fStack_84c,fStack_8c0 * fStack_850);
    uVar12 = local_a08 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar14 = uStack_a00 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar13 = local_a18 & 0x8000000080000000 | 0x3f0000003f000000;
    uVar15 = uStack_a10 & 0x8000000080000000 | 0x3f0000003f000000;
    local_668 = (float)uVar12;
    fStack_664 = (float)(uVar12 >> 0x20);
    fStack_660 = (float)uVar14;
    fStack_65c = (float)(uVar14 >> 0x20);
    local_688 = (float)uVar13;
    fStack_684 = (float)(uVar13 >> 0x20);
    fStack_680 = (float)uVar15;
    fStack_67c = (float)(uVar15 >> 0x20);
    auVar3._4_4_ = (int)(fStack_8a4 * fStack_834 + fStack_664);
    auVar3._0_4_ = (int)(local_8a8 * local_838 + local_668);
    auVar3._12_4_ = (int)(fStack_89c * fStack_82c + fStack_65c);
    auVar3._8_4_ = (int)(fStack_8a0 * fStack_830 + fStack_660);
    auVar2._4_4_ = (int)(fStack_8c4 * fStack_854 + fStack_684);
    auVar2._0_4_ = (int)(local_8c8 * local_858 + local_688);
    auVar2._12_4_ = (int)(fStack_8bc * fStack_84c + fStack_67c);
    auVar2._8_4_ = (int)(fStack_8c0 * fStack_850 + fStack_680);
    auVar17 = packssdw(auVar3,auVar2);
    local_5f8 = auVar17._0_2_;
    sStack_5f6 = auVar17._2_2_;
    sStack_5f4 = auVar17._4_2_;
    sStack_5f2 = auVar17._6_2_;
    sStack_5f0 = auVar17._8_2_;
    sStack_5ee = auVar17._10_2_;
    sStack_5ec = auVar17._12_2_;
    sStack_5ea = auVar17._14_2_;
    uVar10 = (ushort)(0x7f < local_5f8) * 0x7f | (ushort)(0x7f >= local_5f8) * local_5f8;
    uVar11 = (ushort)(0x7f < sStack_5f6) * 0x7f | (ushort)(0x7f >= sStack_5f6) * sStack_5f6;
    uVar18 = (ushort)(0x7f < sStack_5f4) * 0x7f | (ushort)(0x7f >= sStack_5f4) * sStack_5f4;
    uVar19 = (ushort)(0x7f < sStack_5f2) * 0x7f | (ushort)(0x7f >= sStack_5f2) * sStack_5f2;
    uVar20 = (ushort)(0x7f < sStack_5f0) * 0x7f | (ushort)(0x7f >= sStack_5f0) * sStack_5f0;
    uVar21 = (ushort)(0x7f < sStack_5ee) * 0x7f | (ushort)(0x7f >= sStack_5ee) * sStack_5ee;
    uVar22 = (ushort)(0x7f < sStack_5ec) * 0x7f | (ushort)(0x7f >= sStack_5ec) * sStack_5ec;
    uVar23 = (ushort)(0x7f < sStack_5ea) * 0x7f | (ushort)(0x7f >= sStack_5ea) * sStack_5ea;
    local_808._0_4_ =
         CONCAT22((ushort)((short)uVar11 < -0x7f) * -0x7f | ((short)uVar11 >= -0x7f) * uVar11,
                  (ushort)((short)uVar10 < -0x7f) * -0x7f | ((short)uVar10 >= -0x7f) * uVar10);
    local_808._0_6_ =
         CONCAT24((ushort)((short)uVar18 < -0x7f) * -0x7f | ((short)uVar18 >= -0x7f) * uVar18,
                  (undefined4)local_808);
    local_808 = CONCAT26((ushort)((short)uVar19 < -0x7f) * -0x7f | ((short)uVar19 >= -0x7f) * uVar19
                         ,(undefined6)local_808);
    uStack_800._0_2_ = (ushort)((short)uVar20 < -0x7f) * -0x7f | ((short)uVar20 >= -0x7f) * uVar20;
    uStack_800._2_2_ = (ushort)((short)uVar21 < -0x7f) * -0x7f | ((short)uVar21 >= -0x7f) * uVar21;
    uStack_800._4_2_ = (ushort)((short)uVar22 < -0x7f) * -0x7f | ((short)uVar22 >= -0x7f) * uVar22;
    uStack_800._6_2_ = (ushort)((short)uVar23 < -0x7f) * -0x7f | ((short)uVar23 >= -0x7f) * uVar23;
    auVar5._8_8_ = uStack_800;
    auVar5._0_8_ = local_808;
    auVar4._8_8_ = uStack_800;
    auVar4._0_8_ = local_808;
    auVar17 = packsswb(auVar5,auVar4);
    local_818 = auVar17._0_8_;
    *local_970 = local_818;
    local_960 = local_960 + 2;
    local_968 = local_968 + 2;
    local_970 = local_970 + 1;
  }
  return;
}

Assistant:

static void quantize_pack4to8(const float* ptr0, const float* ptr1, signed char* s8ptr, const Mat& scale_data, int elemcount)
{
    const int scale_data_size = scale_data.w;

    // NCNN_LOGE("quantize_pack4to8 %d   %d", scale_data_size, elemcount);

    float scale = scale_data[0];
    __m128 _scale0 = _mm_set1_ps(scale);
    __m128 _scale1 = _scale0;
    if (scale_data_size > 1)
    {
        _scale0 = _mm_loadu_ps((const float*)scale_data);
        _scale1 = _mm_loadu_ps((const float*)scale_data + 4);
    }

    int i = 0;
    for (; i + 1 < elemcount; i += 2)
    {
        __m128 _v0 = _mm_loadu_ps(ptr0);
        __m128 _v1 = _mm_loadu_ps(ptr1);
        __m128 _v2 = _mm_loadu_ps(ptr0 + 4);
        __m128 _v3 = _mm_loadu_ps(ptr1 + 4);
        _v0 = _mm_mul_ps(_v0, _scale0);
        _v1 = _mm_mul_ps(_v1, _scale1);
        _v2 = _mm_mul_ps(_v2, _scale0);
        _v3 = _mm_mul_ps(_v3, _scale1);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_sse(_v0, _v1, _v2, _v3));
        ptr0 += 8;
        ptr1 += 8;
        s8ptr += 16;
    }
    for (; i < elemcount; i++)
    {
        __m128 _v0 = _mm_loadu_ps(ptr0);
        __m128 _v1 = _mm_loadu_ps(ptr1);
        _v0 = _mm_mul_ps(_v0, _scale0);
        _v1 = _mm_mul_ps(_v1, _scale1);
        *(int64_t*)s8ptr = float2int8_sse(_v0, _v1);
        ptr0 += 4;
        ptr1 += 4;
        s8ptr += 8;
    }
}